

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Video::~Video(Video *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Video_00259d68;
  if (this->content != (uint8_t *)0x0) {
    operator_delete__(this->content);
  }
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->fileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->fileName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->relativeFileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->relativeFileName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->type).field_2) {
    operator_delete(pcVar1);
  }
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Video::~Video()
{
    if(content) {
        delete[] content;
    }
}